

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

string * anon_unknown.dwarf_95e467::RelativeIfUnder
                   (string *__return_storage_ptr__,string *top,string *in)

{
  __type _Var1;
  bool bVar2;
  string asStack_38 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  _Var1 = std::operator==(in,top);
  if (_Var1) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    bVar2 = cmsys::SystemTools::IsSubDirectory(in,top);
    if (bVar2) {
      std::__cxx11::string::substr((ulong)asStack_38,(ulong)in);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_38);
      std::__cxx11::string::~string(asStack_38);
    }
    else {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RelativeIfUnder(std::string const& top, std::string const& in)
{
  std::string out;
  if (in == top) {
    out = ".";
  } else if (cmSystemTools::IsSubDirectory(in, top)) {
    out = in.substr(top.size() + 1);
  } else {
    out = in;
  }
  return out;
}